

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collective.hpp
# Opt level: O1

int mxx::scatter_one<int>(vector<int,_std::allocator<int>_> *msgs,int root,comm *comm)

{
  int result;
  int rank;
  int local_30;
  uint local_2c;
  
  if ((comm->m_rank == root) &&
     ((long)(msgs->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)(msgs->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_start >> 2 != (long)comm->m_size)) {
    MPI_Comm_rank(&ompi_mpi_comm_world,&local_2c);
    printf("\n[Rank %d] %s:%d: %s: Assertion `%s` failed. Aborting.\n",(ulong)local_2c,
           "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/include/mxx/collective.hpp"
           ,0xfe,"scatter_one",
           "comm.rank() != root || msgs.size() == static_cast<size_t>(comm.size())");
    fflush(_stdout);
    MPI_Abort(&ompi_mpi_comm_world,0xffffffff);
  }
  scatter<int>((msgs->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
               ._M_start,1,&local_30,root,comm);
  return local_30;
}

Assistant:

T scatter_one(const std::vector<T>& msgs, int root, const mxx::comm& comm = mxx::comm()) {
    MXX_ASSERT(comm.rank() != root || msgs.size() == static_cast<size_t>(comm.size()));
    T result;
    scatter(&msgs[0], 1, &result, root, comm);
    return result;
}